

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_init_gnss_gal_const(fsnav_gal_const *gal_const)

{
  double dVar1;
  
  gal_const->mu = 398600441800000.0;
  gal_const->u = 7.2921151467e-05;
  gal_const->a = 6378137.0;
  gal_const->e2 = 0.0066943800229;
  gal_const->F = -4.442807309e-10;
  gal_const->F1 = 1575420000.0;
  dVar1 = (fsnav->gnss_const).c;
  gal_const->L1 = dVar1 / 1575420000.0;
  gal_const->F5a = 1176450000.0;
  gal_const->L5a = dVar1 / 1176450000.0;
  gal_const->F5b = 1207140000.0;
  gal_const->L5b = dVar1 / 1207140000.0;
  gal_const->F6 = 1278750000.0;
  gal_const->L6 = dVar1 / 1278750000.0;
  return;
}

Assistant:

void fsnav_init_gnss_gal_const(fsnav_gal_const* gal_const)
{
	gal_const->mu  =  3.986004418e14;                    // Earth gravity constant as in Galileo OS SIS ICD Issue 1.2 (November 2015), m^3/s^2
	gal_const->u   =  7.2921151467e-5;                   // Earth rotation rate as in Galileo OS SIS ICD Issue 1.2 (November 2015), rad/s
	gal_const->a   =  6378137.0;                         // Earth ellipsoid semi-major axis as in GRS-80 // JoG March 2000 vol. 74 issue 1, m
	gal_const->e2  =  6.69438002290e-3;                  // Earth ellipsoid first eccentricity squared as in GRS-80 // JoG March 2000 vol. 74 issue 1
	gal_const->F   = -4.442807309e-10;                   // relativistic correction constant as in Galileo OS SIS ICD Issue 1.2 (November 2015), s/sqrt(m)
	gal_const->F1  =  1575.42e6;                         // nominal frequency for E1 signal as in Galileo OS SIS ICD Issue 1.2 (November 2015)
	gal_const->L1  =  fsnav->gnss_const.c/gal_const->F1;  // nominal wavelength for E1 signal
	gal_const->F5a =  1176.45e6;                         // nominal frequency for E5a signal as in Galileo OS SIS ICD Issue 1.2 (November 2015)
	gal_const->L5a =  fsnav->gnss_const.c/gal_const->F5a; // nominal wavelength for E5a signal
	gal_const->F5b =  1207.14e6;                         // nominal frequency for E5b signal as in Galileo OS SIS ICD Issue 1.2 (November 2015)
	gal_const->L5b =  fsnav->gnss_const.c/gal_const->F5b; // nominal wavelength for E5b signal
	gal_const->F6  =  1278.75e6;                         // nominal frequency for E6 signal as in Galileo OS SIS ICD Issue 1.2 (November 2015)
	gal_const->L6  =  fsnav->gnss_const.c/gal_const->F6;  // nominal wavelength for E6 signal
}